

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

VectorXcd __thiscall ChebTools::eigenvalues(ChebTools *this,MatrixXd *A,bool balance)

{
  Index extraout_RDX;
  Index IVar1;
  EigenvaluesReturnType EVar2;
  VectorXcd VVar3;
  undefined1 local_50 [8];
  MatrixXd D;
  MatrixXd Abalanced;
  bool balance_local;
  MatrixXd *A_local;
  
  if (balance) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_50);
    balance_matrix(A,(MatrixXd *)
                     &D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols,(MatrixXd *)local_50);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_50)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    IVar1 = extraout_RDX;
  }
  else {
    EVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues
                      ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    IVar1 = EVar2.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
  }
  VVar3.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = IVar1;
  VVar3.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (complex<double> *)this;
  return (VectorXcd)
         VVar3.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
         m_storage;
}

Assistant:

Eigen::VectorXcd eigenvalues(const Eigen::MatrixXd &A, bool balance) {
        if (balance) {
            Eigen::MatrixXd Abalanced, D;
            balance_matrix(A, Abalanced, D);
            return Abalanced.eigenvalues();
        }
        else {
            return A.eigenvalues();
        }
    }